

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resolveP2Values(Vdbe *p,int *pMaxFuncArgs)

{
  int iVar1;
  Parse *pPVar2;
  int *piVar3;
  int n;
  int *aLabel;
  Parse *pParse;
  Op *pOp;
  int nMaxArgs;
  int *pMaxFuncArgs_local;
  Vdbe *p_local;
  
  pOp._4_4_ = *pMaxFuncArgs;
  pPVar2 = p->pParse;
  piVar3 = pPVar2->aLabel;
  *(ushort *)&p->field_0xc1 = *(ushort *)&p->field_0xc1 & 0xff7f | 0x80;
  *(ushort *)&p->field_0xc1 = *(ushort *)&p->field_0xc1 & 0xfeff;
  pParse = (Parse *)(p->aOp + (p->nOp + -1));
  do {
    if (*(byte *)&pParse->db < 0x54) {
      switch(*(undefined1 *)&pParse->db) {
      case 2:
        if (*(int *)&pParse->zErrMsg != 0) {
          *(ushort *)&p->field_0xc1 = *(ushort *)&p->field_0xc1 & 0xff7f;
        }
      case 0:
      case 1:
        *(ushort *)&p->field_0xc1 = *(ushort *)&p->field_0xc1 & 0xfeff | 0x100;
        break;
      case 3:
      case 5:
      case 7:
        pParse->pVdbe = (Vdbe *)sqlite3BtreeNext;
        *(undefined1 *)((long)&pParse->db + 1) = 0xfb;
        break;
      case 4:
      case 6:
        pParse->pVdbe = (Vdbe *)sqlite3BtreePrevious;
        *(undefined1 *)((long)&pParse->db + 1) = 0xfb;
        break;
      case 8:
      case 9:
      case 10:
        *(ushort *)&p->field_0xc1 = *(ushort *)&p->field_0xc1 & 0xff7f;
        *(ushort *)&p->field_0xc1 = *(ushort *)&p->field_0xc1 & 0xfeff | 0x100;
        break;
      case 0xb:
        iVar1 = *(int *)((long)&pParse[-1].pTriggerPrg + 4);
        if (pOp._4_4_ < iVar1) {
          pOp._4_4_ = iVar1;
        }
        break;
      case 0xc:
        if (pOp._4_4_ < *(int *)&pParse->zErrMsg) {
          pOp._4_4_ = *(int *)&pParse->zErrMsg;
        }
      }
      if (((""[*(byte *)&pParse->db] & 1) != 0) && (*(int *)&pParse->zErrMsg < 0)) {
        *(int *)&pParse->zErrMsg = piVar3[-1 - *(int *)&pParse->zErrMsg];
      }
    }
    if (pParse == (Parse *)p->aOp) {
      sqlite3DbFree(p->db,pPVar2->aLabel);
      pPVar2->aLabel = (int *)0x0;
      pPVar2->nLabel = 0;
      *pMaxFuncArgs = pOp._4_4_;
      return;
    }
    pParse = (Parse *)&pParse[-1].pTriggerPrg;
  } while( true );
}

Assistant:

static void resolveP2Values(Vdbe *p, int *pMaxFuncArgs){
  int nMaxArgs = *pMaxFuncArgs;
  Op *pOp;
  Parse *pParse = p->pParse;
  int *aLabel = pParse->aLabel;
  p->readOnly = 1;
  p->bIsReader = 0;
  pOp = &p->aOp[p->nOp-1];
  while(1){

    /* Only JUMP opcodes and the short list of special opcodes in the switch
    ** below need to be considered.  The mkopcodeh.tcl generator script groups
    ** all these opcodes together near the front of the opcode list.  Skip
    ** any opcode that does not need processing by virtual of the fact that
    ** it is larger than SQLITE_MX_JUMP_OPCODE, as a performance optimization.
    */
    if( pOp->opcode<=SQLITE_MX_JUMP_OPCODE ){
      /* NOTE: Be sure to update mkopcodeh.tcl when adding or removing
      ** cases from this switch! */
      switch( pOp->opcode ){
        case OP_Transaction: {
          if( pOp->p2!=0 ) p->readOnly = 0;
          /* fall thru */
        }
        case OP_AutoCommit:
        case OP_Savepoint: {
          p->bIsReader = 1;
          break;
        }
#ifndef SQLITE_OMIT_WAL
        case OP_Checkpoint:
#endif
        case OP_Vacuum:
        case OP_JournalMode: {
          p->readOnly = 0;
          p->bIsReader = 1;
          break;
        }
#ifndef SQLITE_OMIT_VIRTUALTABLE
        case OP_VUpdate: {
          if( pOp->p2>nMaxArgs ) nMaxArgs = pOp->p2;
          break;
        }
        case OP_VFilter: {
          int n;
          assert( (pOp - p->aOp) >= 3 );
          assert( pOp[-1].opcode==OP_Integer );
          n = pOp[-1].p1;
          if( n>nMaxArgs ) nMaxArgs = n;
          break;
        }
#endif
        case OP_Next:
        case OP_NextIfOpen:
        case OP_SorterNext: {
          pOp->p4.xAdvance = sqlite3BtreeNext;
          pOp->p4type = P4_ADVANCE;
          break;
        }
        case OP_Prev:
        case OP_PrevIfOpen: {
          pOp->p4.xAdvance = sqlite3BtreePrevious;
          pOp->p4type = P4_ADVANCE;
          break;
        }
      }
      if( (sqlite3OpcodeProperty[pOp->opcode] & OPFLG_JUMP)!=0 && pOp->p2<0 ){
        assert( ADDR(pOp->p2)<pParse->nLabel );
        pOp->p2 = aLabel[ADDR(pOp->p2)];
      }
    }
    if( pOp==p->aOp ) break;
    pOp--;
  }
  sqlite3DbFree(p->db, pParse->aLabel);
  pParse->aLabel = 0;
  pParse->nLabel = 0;
  *pMaxFuncArgs = nMaxArgs;
  assert( p->bIsReader!=0 || DbMaskAllZero(p->btreeMask) );
}